

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-hand.cpp
# Opt level: O0

int __thiscall mahjong::PlayerHand::remove(PlayerHand *this,char *__filename)

{
  size_type sVar1;
  iterator iVar2;
  bool bVar3;
  iterator it;
  Tile tile_local;
  PlayerHand *this_local;
  
  it._M_node._4_4_ = (Tile)__filename;
  sVar1 = std::multiset<mahjong::Tile,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>::
          count(&this->tiles,(key_type *)((long)&it._M_node + 4));
  if (sVar1 == 0) {
    __assert_fail("0 < tiles.count(tile)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/src/player-hand.cpp"
                  ,0x13,"void mahjong::PlayerHand::remove(Tile)");
  }
  bVar3 = true;
  if (this->ready_type != not_ready) {
    bVar3 = this->last_tile == it._M_node._4_4_;
  }
  if (!bVar3) {
    __assert_fail("ready_type == ReadyType::not_ready || last_tile == tile",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/src/player-hand.cpp"
                  ,0x14,"void mahjong::PlayerHand::remove(Tile)");
  }
  iVar2 = std::multiset<mahjong::Tile,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>::
          find(&this->tiles,(key_type *)((long)&it._M_node + 4));
  iVar2 = std::multiset<mahjong::Tile,std::less<mahjong::Tile>,std::allocator<mahjong::Tile>>::
          erase_abi_cxx11_((multiset<mahjong::Tile,std::less<mahjong::Tile>,std::allocator<mahjong::Tile>>
                            *)&this->tiles,iVar2._M_node);
  return (int)iVar2._M_node;
}

Assistant:

void PlayerHand::remove(Tile tile)
{
	assert(0 < tiles.count(tile));
	assert(ready_type == ReadyType::not_ready || last_tile == tile);

	auto it = tiles.find(tile);
	tiles.erase(it);
}